

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statement.cpp
# Opt level: O3

void __thiscall SQLite::Statement::Statement(Statement *this,Statement *aStatement)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  undefined8 uVar5;
  element_type *peVar6;
  
  paVar1 = &(this->mQuery).field_2;
  (this->mQuery)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (aStatement->mQuery)._M_dataplus._M_p;
  paVar2 = &(aStatement->mQuery).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar5 = *(undefined8 *)((long)&(aStatement->mQuery).field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->mQuery).field_2 + 8) = uVar5;
  }
  else {
    (this->mQuery)._M_dataplus._M_p = pcVar3;
    (this->mQuery).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->mQuery)._M_string_length = (aStatement->mQuery)._M_string_length;
  (aStatement->mQuery)._M_dataplus._M_p = (pointer)paVar2;
  (aStatement->mQuery)._M_string_length = 0;
  (aStatement->mQuery).field_2._M_local_buf[0] = '\0';
  peVar6 = (aStatement->mpPreparedStatement).
           super___shared_ptr<sqlite3_stmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  this->mpSQLite = aStatement->mpSQLite;
  (this->mpPreparedStatement).super___shared_ptr<sqlite3_stmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       peVar6;
  (this->mpPreparedStatement).super___shared_ptr<sqlite3_stmt,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var4 = (aStatement->mpPreparedStatement).
           super___shared_ptr<sqlite3_stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (aStatement->mpPreparedStatement).super___shared_ptr<sqlite3_stmt,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->mpPreparedStatement).super___shared_ptr<sqlite3_stmt,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var4;
  (aStatement->mpPreparedStatement).super___shared_ptr<sqlite3_stmt,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  this->mColumnCount = aStatement->mColumnCount;
  this->mbHasRow = aStatement->mbHasRow;
  this->mbDone = aStatement->mbDone;
  std::_Rb_tree_header::_Rb_tree_header
            (&(this->mColumnNames)._M_t._M_impl.super__Rb_tree_header,
             &(aStatement->mColumnNames)._M_t._M_impl.super__Rb_tree_header);
  aStatement->mpSQLite = (sqlite3 *)0x0;
  aStatement->mColumnCount = 0;
  aStatement->mbHasRow = false;
  aStatement->mbDone = false;
  return;
}

Assistant:

Statement::Statement(Statement&& aStatement) noexcept :
    mQuery(std::move(aStatement.mQuery)),
    mpSQLite(aStatement.mpSQLite),
    mpPreparedStatement(std::move(aStatement.mpPreparedStatement)),
    mColumnCount(aStatement.mColumnCount),
    mbHasRow(aStatement.mbHasRow),
    mbDone(aStatement.mbDone),
    mColumnNames(std::move(aStatement.mColumnNames))
{
    aStatement.mpSQLite = nullptr;
    aStatement.mColumnCount = 0;
    aStatement.mbHasRow = false;
    aStatement.mbDone = false;
}